

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void dumpRanges(DWARFObject *Obj,raw_ostream *OS,DWARFAddressRangesVector *Ranges,uint AddressSize,
               uint Indent,DIDumpOptions *DumpOpts)

{
  DIDumpOptions DumpOpts_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference this;
  ushort uStack_72;
  DWARFAddressRange *R;
  const_iterator __end1;
  const_iterator __begin1;
  DWARFAddressRangesVector *__range1;
  undefined1 local_40 [8];
  ArrayRef<llvm::SectionName> SectionNames;
  DIDumpOptions *DumpOpts_local;
  uint Indent_local;
  uint AddressSize_local;
  DWARFAddressRangesVector *Ranges_local;
  raw_ostream *OS_local;
  DWARFObject *Obj_local;
  
  if ((DumpOpts->ShowAddresses & 1U) != 0) {
    SectionNames.Length = (size_type)DumpOpts;
    llvm::ArrayRef<llvm::SectionName>::ArrayRef((ArrayRef<llvm::SectionName> *)local_40);
    if ((*(byte *)(SectionNames.Length + 0x14) & 1) != 0) {
      iVar3 = (*Obj->_vptr_DWARFObject[4])();
      local_40 = (undefined1  [8])CONCAT44(extraout_var,iVar3);
    }
    __end1 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                       (Ranges);
    R = (DWARFAddressRange *)
        std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end(Ranges);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                       *)&R), bVar2) {
      this = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::operator*(&__end1);
      llvm::raw_ostream::operator<<(OS,'\n');
      llvm::raw_ostream::indent(OS,Indent);
      lVar1 = (ulong)uStack_72 << 0x30;
      DumpOpts_00.ParentRecurseDepth = 0xffffffff;
      DumpOpts_00.Version = 0;
      DumpOpts_00.AddrSize = '\x04';
      DumpOpts_00.ShowAddresses = true;
      DumpOpts_00.DumpType = 0xffffffff;
      DumpOpts_00.ChildRecurseDepth = 0xffffffff;
      DumpOpts_00.ShowChildren = (bool)(char)lVar1;
      DumpOpts_00.ShowParents = (bool)(char)((ulong)lVar1 >> 8);
      DumpOpts_00.ShowForm = (bool)(char)((ulong)lVar1 >> 0x10);
      DumpOpts_00.SummarizeTypes = (bool)(char)((ulong)lVar1 >> 0x18);
      DumpOpts_00.Verbose = (bool)(char)((ulong)lVar1 >> 0x20);
      DumpOpts_00.DisplayRawContents = (bool)(char)((ulong)lVar1 >> 0x28);
      DumpOpts_00._22_2_ = (short)((ulong)lVar1 >> 0x30);
      llvm::DWARFAddressRange::dump(this,OS,AddressSize,DumpOpts_00);
      llvm::DWARFFormValue::dumpAddressSection
                (Obj,OS,*(DIDumpOptions *)SectionNames.Length,this->SectionIndex);
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

static void dumpRanges(const DWARFObject &Obj, raw_ostream &OS,
                       const DWARFAddressRangesVector &Ranges,
                       unsigned AddressSize, unsigned Indent,
                       const DIDumpOptions &DumpOpts) {
  if (!DumpOpts.ShowAddresses)
    return;

  ArrayRef<SectionName> SectionNames;
  if (DumpOpts.Verbose)
    SectionNames = Obj.getSectionNames();

  for (const DWARFAddressRange &R : Ranges) {
    OS << '\n';
    OS.indent(Indent);
    R.dump(OS, AddressSize);

    DWARFFormValue::dumpAddressSection(Obj, OS, DumpOpts, R.SectionIndex);
  }
}